

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::softmax(tensor *dest,tensor *src,operation_mode mode)

{
  uint *puVar1;
  bool bVar2;
  ostream *poVar3;
  fatal_error *pfVar4;
  string sStack_1b8;
  ostringstream dlib_o_out;
  uint auStack_180 [88];
  
  bVar2 = have_same_dimensions(dest,src);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar3 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x6f1);
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar3 = std::operator<<(poVar3,
                             "void dlib::cpu::softmax(tensor &, const tensor &, operation_mode)");
    std::operator<<(poVar3,".\n\n");
    poVar3 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar3 = std::operator<<(poVar3,"have_same_dimensions(dest, src)");
    std::operator<<(poVar3,".\n");
    puVar1 = (uint *)((long)auStack_180 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar3 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar3,"\n");
    pfVar4 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar4,EBROKEN_ASSERT,&sStack_1b8);
    __cxa_throw(pfVar4,&fatal_error::typeinfo,error::~error);
  }
  if (mode < 2) {
    ttimpl::softmax(src->m_nc * src->m_nr,src->m_k,dest,src,mode);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x6f2);
  std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                          );
  std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar3 = std::operator<<(poVar3,
                           "void dlib::cpu::softmax(tensor &, const tensor &, operation_mode)");
  std::operator<<(poVar3,".\n\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar3 = std::operator<<(poVar3,
                           "mode == operation_mode::CHANNEL_WISE || mode == operation_mode::PLANE_WISE"
                          );
  std::operator<<(poVar3,".\n");
  puVar1 = (uint *)((long)auStack_180 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Invalid softmax mode");
  std::operator<<(poVar3,"\n");
  pfVar4 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar4,EBROKEN_ASSERT,&sStack_1b8);
  __cxa_throw(pfVar4,&fatal_error::typeinfo,error::~error);
}

Assistant:

void softmax(
            tensor& dest,
            const tensor& src,
            operation_mode mode
        )
        {
            DLIB_CASSERT(have_same_dimensions(dest, src));
            DLIB_CASSERT(mode == operation_mode::CHANNEL_WISE || mode == operation_mode::PLANE_WISE, "Invalid softmax mode");
            ttimpl::softmax(src.nr() * src.nc(), src.k(), dest, src, mode);
        }